

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05_algorithm.cc
# Opt level: O2

int main(void)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ostream *poVar3;
  allocator_type *__a;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_142;
  anon_class_1_0_00000001 quote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_words;
  result_type local_128;
  result_type *local_108;
  undefined8 local_100;
  iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_examples_tutorial_05_algorithm_cc:21:16)_&>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_b0 [8];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"a",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"bb",(allocator<char> *)&long_words);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"looong",(allocator<char> *)&local_f8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"looooong",(allocator<char> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"with, comma, and, space",(allocator<char> *)&quote);
  __a = &local_142;
  __l._M_len = 5;
  __l._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&words,__l,__a);
  lVar5 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_d0._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  get_words_longer_than(&long_words,&words,3);
  ezy::
  join<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3]>
            (&local_d0,(ezy *)&long_words,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",(char (*) [3])__a);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_d0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_d0);
  if (long_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      long_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_d0._M_dataplus._M_p =
         (pointer)long_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_d0._M_string_length = (size_type)&quote;
    ezy::detail::
    iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/tutorial/05_algorithm.cc:21:16)_&>
    ::operator*(&local_128,
                (iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_examples_tutorial_05_algorithm_cc:21:16)_&>
                 *)&local_d0);
    pbVar1 = long_words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_100 = 0x202c;
    _Var2._M_current =
         long_words.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 2;
    local_108 = &local_128;
    local_f8.
    super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .orig._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(long_words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1);
    local_f8.converter = &quote;
    while (_Var4._M_current = _Var2._M_current, _Var4._M_current + -1 != pbVar1) {
      ezy::detail::
      iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/tutorial/05_algorithm.cc:21:16)_&>
      ::operator*(&local_d0,&local_f8);
      std::__cxx11::string::append((char *)local_108);
      std::__cxx11::string::append((string *)local_108);
      std::__cxx11::string::~string((string *)&local_d0);
      local_f8.
      super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .orig._M_current =
           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )_Var4._M_current;
      _Var2._M_current = _Var4._M_current + 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_128);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_128);
  pbVar1 = long_words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_128._M_string_length = 0;
  for (local_128._M_dataplus._M_p =
            (pointer)long_words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      (local_128._M_string_length != 0xffffffffffffffff &&
      ((pointer)local_128._M_dataplus._M_p != pbVar1));
      local_128._M_dataplus._M_p = local_128._M_dataplus._M_p + 0x20) {
    ezy::detail::
    iterator_zipper<ezy::make_tuple_fn,ezy::detail::iterate_view<unsigned_long,ezy::detail::increment>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>
    ::deref_helper<0ul,1ul>(&local_d0,&local_128);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_d0);
    local_128._M_string_length = local_128._M_string_length + 1;
  }
  local_128._M_string_length._0_4_ = 1;
  while ((local_128._M_dataplus._M_p =
               (pointer)long_words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
         (int)local_128._M_string_length != 0x7fffffff &&
         (long_words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          long_words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish))) {
    ezy::detail::
    iterator_zipper<ezy::make_tuple_fn,ezy::detail::iterate_view<int,ezy::detail::increment>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>
    ::deref_helper<0ul,1ul>(&local_d0,&local_128);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_b0[0]);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_d0);
    local_128._M_string_length._0_4_ = (int)local_128._M_string_length + 1;
    long_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(local_128._M_dataplus._M_p + 0x20);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&long_words);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  return 4;
}

Assistant:

int main()
{
  const std::vector<std::string> words{"a", "bb", "looong", "looooong", "with, comma, and, space"};
  const auto long_words = get_words_longer_than(words, 3);
  std::cout << ezy::join(long_words, ", ") << "\n";

  auto quote = [](const std::string &s) { return std::string() + "\"" + s + "\""; };
  std::cout << ezy::join(ezy::transform(long_words, quote), ", ") << "\n";

  //
  const auto print_with_number = [](const auto& element)
  {
    const auto& [i, word] = element;
    std::cout << i << ". " << word << "\n";
  };

  ezy::for_each(ezy::enumerate(long_words), print_with_number);

  ezy::for_each(ezy::zip(ezy::iterate(1), long_words), print_with_number);
  return 4;
}